

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  double dVar1;
  double dVar2;
  MadAccessor<double,_double,_double> *pMVar3;
  CURSOR *pCVar4;
  ColumnDataScanState *pCVar5;
  bool bVar6;
  reference pvVar7;
  ColumnDataScanState *pCVar8;
  
  pMVar3 = this->accessor_l->outer;
  pCVar4 = this->accessor_l->inner->data;
  pCVar5 = (ColumnDataScanState *)*lhs;
  pCVar8 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
  if ((ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar5 || pCVar5 < pCVar8) {
    duckdb::ColumnDataCollection::Seek((ulong)pCVar4->inputs,pCVar5,(DataChunk *)&pCVar4->scan);
    pvVar7 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
    pCVar4->data = *(double **)(pvVar7 + 0x20);
    pvVar7 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
    FlatVector::VerifyFlatVector(pvVar7);
    pCVar4->validity = (ValidityMask *)(pvVar7 + 0x28);
    pCVar8 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
  }
  dVar1 = pCVar4->data[(uint)((int)pCVar5 - (int)pCVar8)];
  dVar2 = *pMVar3->median;
  pMVar3 = this->accessor_r->outer;
  pCVar4 = this->accessor_r->inner->data;
  pCVar5 = (ColumnDataScanState *)*rhs;
  pCVar8 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
  if ((ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar5 || pCVar5 < pCVar8) {
    duckdb::ColumnDataCollection::Seek((ulong)pCVar4->inputs,pCVar5,(DataChunk *)&pCVar4->scan);
    pvVar7 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
    pCVar4->data = *(double **)(pvVar7 + 0x20);
    pvVar7 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
    FlatVector::VerifyFlatVector(pvVar7);
    pCVar4->validity = (ValidityMask *)(pvVar7 + 0x28);
    pCVar8 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
  }
  dVar1 = ABS(dVar1 - dVar2);
  dVar2 = ABS(pCVar4->data[(uint)((int)pCVar5 - (int)pCVar8)] - *pMVar3->median);
  bVar6 = dVar1 < dVar2;
  if (this->desc != false) {
    bVar6 = dVar2 < dVar1;
  }
  return bVar6;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}